

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llama-bench.cpp
# Opt level: O1

string * csv_printer::escape_csv(string *__return_storage_ptr__,string *field)

{
  size_type sVar1;
  pointer pcVar2;
  size_type sVar3;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"","");
  sVar1 = field->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (field->_M_dataplus)._M_p;
    sVar3 = 0;
    do {
      if (pcVar2[sVar3] == '\"') {
        std::__cxx11::string::append((char *)__return_storage_ptr__);
      }
      std::__cxx11::string::push_back((char)__return_storage_ptr__);
      sVar3 = sVar3 + 1;
    } while (sVar1 != sVar3);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

static std::string escape_csv(const std::string & field) {
        std::string escaped = "\"";
        for (auto c : field) {
            if (c == '"') {
                escaped += "\"";
            }
            escaped += c;
        }
        escaped += "\"";
        return escaped;
    }